

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

void Abc_ManResubDivsS(Abc_ManRes_t *p,int Required)

{
  void *pvVar1;
  void *Entry;
  int local_38;
  int local_34;
  int w;
  int i;
  uint *puDataR;
  uint *puData;
  Abc_Obj_t *pObj;
  int Required_local;
  Abc_ManRes_t *p_local;
  
  Vec_PtrClear(p->vDivs1UP);
  Vec_PtrClear(p->vDivs1UN);
  Vec_PtrClear(p->vDivs1B);
  pvVar1 = (p->pRoot->field_5).pData;
  for (local_34 = 0; local_34 < p->nDivs; local_34 = local_34 + 1) {
    Entry = Vec_PtrEntry(p->vDivs,local_34);
    if ((int)(*(uint *)((long)Entry + 0x14) >> 0xc) <= Required + -1) {
      local_38 = 0;
      while ((local_38 < p->nWords &&
             ((*(uint *)(*(long *)((long)Entry + 0x38) + (long)local_38 * 4) &
               (*(uint *)((long)pvVar1 + (long)local_38 * 4) ^ 0xffffffff) & p->pCareSet[local_38])
              == 0))) {
        local_38 = local_38 + 1;
      }
      if (local_38 == p->nWords) {
        Vec_PtrPush(p->vDivs1UP,Entry);
      }
      else {
        local_38 = 0;
        while ((local_38 < p->nWords &&
               (((*(uint *)(*(long *)((long)Entry + 0x38) + (long)local_38 * 4) ^ 0xffffffff) &
                 *(uint *)((long)pvVar1 + (long)local_38 * 4) & p->pCareSet[local_38]) == 0))) {
          local_38 = local_38 + 1;
        }
        if (local_38 == p->nWords) {
          Vec_PtrPush(p->vDivs1UN,Entry);
        }
        else {
          Vec_PtrPush(p->vDivs1B,Entry);
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_ManResubDivsS( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj;
    unsigned * puData, * puDataR;
    int i, w;
    Vec_PtrClear( p->vDivs1UP );
    Vec_PtrClear( p->vDivs1UN );
    Vec_PtrClear( p->vDivs1B );
    puDataR = (unsigned *)p->pRoot->pData;
    Vec_PtrForEachEntryStop( Abc_Obj_t *, p->vDivs, pObj, i, p->nDivs )
    {
        if ( (int)pObj->Level > Required - 1 )
            continue;

        puData = (unsigned *)pObj->pData;
        // check positive containment
        for ( w = 0; w < p->nWords; w++ )
//            if ( puData[w] & ~puDataR[w] )
            if ( puData[w] & ~puDataR[w] & p->pCareSet[w] ) // care set
                break;
        if ( w == p->nWords )
        {
            Vec_PtrPush( p->vDivs1UP, pObj );
            continue;
        }
        // check negative containment
        for ( w = 0; w < p->nWords; w++ )
//            if ( ~puData[w] & puDataR[w] )
            if ( ~puData[w] & puDataR[w] & p->pCareSet[w] ) // care set
                break;
        if ( w == p->nWords )
        {
            Vec_PtrPush( p->vDivs1UN, pObj );
            continue;
        }
        // add the node to binates
        Vec_PtrPush( p->vDivs1B, pObj );
    }
}